

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O0

void __thiscall
SimpleBVH::BVH::get_nearest_facet_hint
          (BVH *this,VectorMax3d *p,int *nearest_f,VectorMax3d *nearest_point,double *sq_dist)

{
  int *piVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  double dVar4;
  double dVar5;
  RealScalar RVar6;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
  local_80;
  VectorMax3d local_68;
  int local_48;
  int local_44;
  int childr;
  int childl;
  int m;
  int n;
  int e;
  int b;
  double *sq_dist_local;
  VectorMax3d *nearest_point_local;
  int *nearest_f_local;
  VectorMax3d *p_local;
  BVH *this_local;
  
  n = 0;
  m = (int)this->n_corners;
  childl = 1;
  _e = sq_dist;
  sq_dist_local = (double *)nearest_point;
  nearest_point_local = (VectorMax3d *)nearest_f;
  nearest_f_local = (int *)p;
  p_local = (VectorMax3d *)this;
  while (piVar1 = nearest_f_local, m != n + 1) {
    childr = n + (m - n) / 2;
    local_44 = childl << 1;
    local_48 = childl * 2 + 1;
    pvVar2 = std::
             vector<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>_>_>
             ::operator[](&this->boxlist,(long)local_44);
    dVar4 = anon_unknown_6::point_box_center_squared_distance((VectorMax3d *)piVar1,pvVar2);
    piVar1 = nearest_f_local;
    pvVar2 = std::
             vector<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>_>_>
             ::operator[](&this->boxlist,(long)local_48);
    dVar5 = anon_unknown_6::point_box_center_squared_distance((VectorMax3d *)piVar1,pvVar2);
    if (dVar5 <= dVar4) {
      n = childr;
      childl = local_48;
    }
    else {
      m = childr;
      childl = local_44;
    }
  }
  *(int *)(nearest_point_local->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
          m_storage.m_data.array = n;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&this->new2old,
                      (long)*(int *)(nearest_point_local->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                                    m_storage.m_data.array);
  point_callback(&local_68,this,*pvVar3);
  Eigen::Matrix<double,_-1,_1,_0,_3,_1>::operator=
            ((Matrix<double,__1,_1,_0,_3,_1> *)sq_dist_local,&local_68);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
            (&local_80,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)nearest_f_local,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)sq_dist_local);
  RVar6 = Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>_>
          ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                         *)&local_80);
  *_e = RVar6;
  return;
}

Assistant:

void BVH::get_nearest_facet_hint(
    const VectorMax3d& p,
    int& nearest_f,
    VectorMax3d& nearest_point,
    double& sq_dist) const
{
    int b = 0;
    int e = n_corners;
    int n = 1;
    while (e != b + 1) {
        int m = b + (e - b) / 2;
        int childl = 2 * n;
        int childr = 2 * n + 1;
        if (point_box_center_squared_distance(p, boxlist[childl])
            < point_box_center_squared_distance(p, boxlist[childr])) {
            e = m;
            n = childl;
        } else {
            b = m;
            n = childr;
        }
    }
    nearest_f = b;

    nearest_point = point_callback(new2old[nearest_f]);
    sq_dist = (p - nearest_point).squaredNorm();
}